

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_chunk_init(uchar **chunk,ucvector *out,uint length,char *type)

{
  uchar *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  size_t size;
  ulong uVar5;
  
  uVar5 = (ulong)length;
  uVar3 = 0x4d;
  uVar4 = out->size + uVar5;
  if ((!CARRY8(out->size,uVar5)) && (size = uVar4 + 0xc, uVar4 < 0xfffffffffffffff4)) {
    uVar3 = ucvector_resize(out,size);
    if (uVar3 == 0) {
      uVar3 = 0x53;
    }
    else {
      puVar1 = out->data;
      lVar2 = size - uVar5;
      *chunk = puVar1 + lVar2 + -0xc;
      puVar1[lVar2 + -0xc] = (uchar)(length >> 0x18);
      puVar1[lVar2 + -0xb] = (uchar)(length >> 0x10);
      puVar1[lVar2 + -10] = (uchar)(length >> 8);
      puVar1[lVar2 + -9] = (uchar)length;
      *(undefined4 *)(*chunk + 4) = *(undefined4 *)type;
      uVar3 = 0;
    }
  }
  return uVar3;
}

Assistant:

static unsigned lodepng_chunk_init(unsigned char** chunk,
                                   ucvector* out,
                                   unsigned length, const char* type) {
  size_t new_length = out->size;
  if(lodepng_addofl(new_length, length, &new_length)) return 77;
  if(lodepng_addofl(new_length, 12, &new_length)) return 77;
  if(!ucvector_resize(out, new_length)) return 83; /*alloc fail*/
  *chunk = out->data + new_length - length - 12u;

  /*1: length*/
  lodepng_set32bitInt(*chunk, length);

  /*2: chunk name (4 letters)*/
  lodepng_memcpy(*chunk + 4, type, 4);

  return 0;
}